

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_apu.c
# Opt level: O3

void apu_square(nesapu_state *info,square_t *chan)

{
  byte bVar1;
  uint32 uVar2;
  int iVar3;
  uint uVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  byte bVar8;
  int iVar9;
  int iVar10;
  float fVar11;
  
  if ((chan->enabled != true) || (chan->Muted == true)) goto LAB_0015d52f;
  bVar1 = chan->regs[0];
  uVar4 = bVar1 & 0xf;
  uVar2 = info->sync_times1[uVar4];
  fVar11 = chan->env_phase + -4.0;
  chan->env_phase = fVar11;
  if (fVar11 < 0.0) {
    bVar5 = chan->env_vol;
    do {
      if ((bVar1 & 0x20) == 0) {
        if (bVar5 < 0xf) {
          bVar5 = bVar5 + 1;
          goto LAB_0015d441;
        }
      }
      else {
        bVar5 = bVar5 + 1 & 0xf;
LAB_0015d441:
        chan->env_vol = bVar5;
      }
      fVar11 = fVar11 + (float)(int)uVar2;
    } while (fVar11 < 0.0);
    chan->env_phase = fVar11;
  }
  iVar6 = chan->vbl_length;
  if (iVar6 < 1) {
LAB_0015d463:
    if (iVar6 == 0) goto LAB_0015d52f;
  }
  else if ((bVar1 & 0x20) == 0) {
    iVar6 = iVar6 + -1;
    chan->vbl_length = iVar6;
    goto LAB_0015d463;
  }
  bVar5 = chan->regs[1];
  if ((bVar5 & 7) != 0 && (char)bVar5 < '\0') {
    iVar6 = *(int *)((long)info->sync_times1 + (ulong)(bVar5 >> 2 & 0x1c));
    fVar11 = chan->sweep_phase + -2.0;
    chan->sweep_phase = fVar11;
    if (fVar11 < 0.0) {
      iVar9 = chan->freq;
      do {
        iVar10 = iVar9 >> (bVar5 & 7);
        iVar3 = -iVar10;
        if ((bVar5 & 8) == 0) {
          iVar3 = iVar10;
        }
        fVar11 = fVar11 + (float)iVar6;
        iVar9 = iVar3 + iVar9;
      } while (fVar11 < 0.0);
      chan->freq = iVar9;
      chan->sweep_phase = fVar11;
    }
  }
  if ((bVar5 & 8) == 0) {
    bVar8 = 7;
    if ((char)bVar5 < '\0') {
      bVar8 = bVar5 & 7;
    }
    uVar7 = chan->freq;
    if (freq_limit[bVar8] < (int)uVar7 >> 0x10) goto LAB_0015d52f;
  }
  else {
    uVar7 = chan->freq;
  }
  if (0x3ffff < (int)uVar7) {
    fVar11 = chan->phaseacc - info->apu_incsize;
    chan->phaseacc = fVar11;
    if (fVar11 < 0.0) {
      bVar5 = chan->adder;
      do {
        fVar11 = fVar11 + (float)(uVar7 >> 0x10);
        bVar5 = bVar5 + 1 & 0xf;
      } while (fVar11 < 0.0);
      chan->phaseacc = fVar11;
      chan->adder = bVar5;
    }
    if ((bVar1 & 0x10) == 0) {
      uVar4 = (uint)(byte)(0xf - chan->env_vol);
    }
    chan->output = (char)uVar4;
    if (((uint)duty_lut[bVar1 >> 6] >> ((byte)(7 - (chan->adder >> 1)) & 0x1f) & 1) != 0) {
      chan->output = -(char)uVar4;
    }
    return;
  }
LAB_0015d52f:
  chan->output = '\0';
  return;
}

Assistant:

static void apu_square(nesapu_state *info, square_t *chan)
{
	int env_delay;
	int sweep_delay;
	uint8 freq_index;

	/* reg0: 0-3=volume, 4=envelope, 5=hold, 6-7=duty cycle
	** reg1: 0-2=sweep shifts, 3=sweep inc/dec, 4-6=sweep length, 7=sweep on
	** reg2: 8 bits of freq
	** reg3: 0-2=high freq, 7-4=vbl length counter
	*/

	if (!chan->enabled || chan->Muted)
	{
		chan->output = 0;
		return;
	}

	/* enveloping */
	env_delay = info->sync_times1[chan->regs[0] & 0x0f];

	/* decay is at a rate of (env_regs + 1) / 240 secs */
	chan->env_phase -= 4;
	while (chan->env_phase < 0)
	{
		chan->env_phase += env_delay;
		if (chan->regs[0] & 0x20)
			chan->env_vol = (chan->env_vol + 1) & 15;
		else if (chan->env_vol < 15)
			chan->env_vol++;
	}

	/* vbl length counter */
	if (chan->vbl_length > 0 && !(chan->regs [0] & 0x20))
		chan->vbl_length--;

	if (!chan->vbl_length)
	{
		chan->output = 0;
		return;
	}

	/* freqsweeps */
	if ((chan->regs[1] & 0x80) && (chan->regs[1] & 7))
	{
		sweep_delay = info->sync_times1[(chan->regs[1] >> 4) & 7];
		chan->sweep_phase -= 2;
		while (chan->sweep_phase < 0)
		{
			chan->sweep_phase += sweep_delay;
			if (chan->regs[1] & 8)
				chan->freq -= chan->freq >> (chan->regs[1] & 7);
			else
				chan->freq += chan->freq >> (chan->regs[1] & 7);
		}
	}

	// Thanks to Delek for the fix
	if (chan->regs[1] & 0x80)
		freq_index = chan->regs[1] & 7;	//If sweeping is enabled, I choose it as normal.
	else
		freq_index = 7;	//If sweeping is disabled, I choose the lower limit.
	//if ((!(chan->regs[1] & 8) && (chan->freq >> 16) > freq_limit[chan->regs[1] & 7])	// original
	if ((!(chan->regs[1] & 8) && (chan->freq >> 16) > freq_limit[freq_index])	// fixed
		 || (chan->freq >> 16) < 4)
	{
		chan->output = 0;
		return;
	}

	chan->phaseacc -= (float) info->apu_incsize; /* # of cycles per sample */

	while (chan->phaseacc < 0)
	{
		chan->phaseacc += (chan->freq >> 16);
		chan->adder = (chan->adder + 1) & 0x0f;
	}

	if (chan->regs[0] & 0x10) /* fixed volume */
		chan->output = chan->regs[0] & 0x0F;
	else
		chan->output = 0x0f - chan->env_vol;

	//BIT( duty_lut[chan->regs[0] >> 6],  7 - BIT(chan->adder, 1, 3) );
	if (duty_lut[chan->regs[0] >> 6] & (1 << (7 - (chan->adder >> 1))))
		chan->output = -chan->output;
}